

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O0

void do_cmd_wiz_tweak_item(command_conflict *cmd)

{
  undefined1 uVar1;
  undefined2 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  _Bool _Var8;
  wchar_t wVar9;
  ego_item *peVar10;
  artifact *paVar11;
  char local_218 [8];
  char prompt_3 [80];
  char prompt_2 [80];
  char prompt_1 [80];
  char prompt [80];
  bitflag notice_1;
  loc_conflict grid_1;
  uint16_t oidx_1;
  object *known_1;
  object *next_1;
  object *prev_1;
  artifact *a;
  bitflag notice;
  loc_conflict grid;
  uint16_t oidx;
  object *known;
  object *next;
  object *prev;
  ego_item *e;
  int local_70;
  wchar_t update;
  wchar_t val;
  wchar_t i;
  char tmp_val [80];
  object *obj;
  command_conflict *cmd_local;
  
  e._4_4_ = 0;
  wVar9 = cmd_get_arg_item((command *)cmd,"item",(object **)(tmp_val + 0x48));
  if (wVar9 != L'\0') {
    _Var8 = get_item((object **)(tmp_val + 0x48),"Tweak which item? ","You have nothing to tweak.",
                     cmd->code,(item_tester)0x0,L'\x0f');
    if (!_Var8) {
      return;
    }
    cmd_set_arg_item((command *)cmd,"item",(object *)tmp_val._72_8_);
  }
  if (*(long *)(tmp_val._72_8_ + 0x10) == 0) {
    wVar9 = cmd_get_arg_choice((command *)cmd,"update",(int *)((long)&e + 4));
    if (wVar9 != L'\0') {
      e._4_4_ = 1;
    }
    if (*(long *)(tmp_val._72_8_ + 8) == 0) {
      strnfmt((char *)&val,0x50,"-1");
    }
    else {
      strnfmt((char *)&val,0x50,"%s",*(undefined8 *)(*(long *)(tmp_val._72_8_ + 8) + 8));
    }
    _Var8 = get_string("Enter ego item: ",(char *)&val,0x50);
    if (_Var8) {
      _Var8 = get_int_from_string((char *)&val,&local_70);
      if (_Var8) {
        if ((local_70 < 0) || ((int)(uint)z_info->e_max <= local_70)) {
          *(undefined8 *)(tmp_val._72_8_ + 8) = 0;
        }
        else {
          *(ego_item **)(tmp_val._72_8_ + 8) = e_info + local_70;
        }
      }
      else {
        peVar10 = lookup_ego_item((char *)&val,(uint)*(byte *)(tmp_val._72_8_ + 0x3c),
                                  (uint)*(byte *)(tmp_val._72_8_ + 0x3d));
        *(ego_item **)(tmp_val._72_8_ + 8) = peVar10;
      }
      if (*(long *)(tmp_val._72_8_ + 8) != 0) {
        uVar3 = *(undefined8 *)(tmp_val._72_8_ + 8);
        uVar4 = *(undefined8 *)(tmp_val._72_8_ + 0x18);
        uVar5 = *(undefined8 *)(tmp_val._72_8_ + 0x20);
        uVar6 = *(undefined8 *)(tmp_val._72_8_ + 0x28);
        uVar2 = *(undefined2 *)(tmp_val._72_8_ + 0x30);
        uVar7 = *(undefined8 *)(tmp_val._72_8_ + 0x34);
        uVar1 = *(undefined1 *)(tmp_val._72_8_ + 299);
        object_prep((object *)tmp_val._72_8_,*(object_kind **)tmp_val._72_8_,(int)player->depth,
                    RANDOMISE);
        *(undefined8 *)(tmp_val._72_8_ + 8) = uVar3;
        *(undefined8 *)(tmp_val._72_8_ + 0x18) = uVar4;
        *(undefined8 *)(tmp_val._72_8_ + 0x20) = uVar5;
        *(undefined8 *)(tmp_val._72_8_ + 0x28) = uVar6;
        *(undefined2 *)(tmp_val._72_8_ + 0x30) = uVar2;
        *(undefined8 *)(tmp_val._72_8_ + 0x34) = uVar7;
        *(undefined1 *)(tmp_val._72_8_ + 299) = uVar1;
        ego_apply_magic((object *)tmp_val._72_8_,(int)player->depth,RANDOMISE);
      }
      wiz_display_item((object *)tmp_val._72_8_,true,player);
      if (*(long *)(tmp_val._72_8_ + 0x10) == 0) {
        strnfmt((char *)&val,0x50,"0");
      }
      else {
        strnfmt((char *)&val,0x50,"%s",**(undefined8 **)(tmp_val._72_8_ + 0x10));
      }
      _Var8 = get_string("Enter new artifact: ",(char *)&val,0x50);
      if (_Var8) {
        _Var8 = get_int_from_string((char *)&val,&local_70);
        if (_Var8) {
          if ((local_70 < 1) || ((int)(uint)z_info->a_max <= local_70)) {
            *(undefined8 *)(tmp_val._72_8_ + 0x10) = 0;
          }
          else {
            *(artifact **)(tmp_val._72_8_ + 0x10) = a_info + local_70;
          }
        }
        else {
          paVar11 = lookup_artifact_name((char *)&val);
          *(artifact **)(tmp_val._72_8_ + 0x10) = paVar11;
        }
        if (*(long *)(tmp_val._72_8_ + 0x10) != 0) {
          uVar3 = *(undefined8 *)(tmp_val._72_8_ + 0x10);
          uVar4 = *(undefined8 *)(tmp_val._72_8_ + 0x18);
          uVar5 = *(undefined8 *)(tmp_val._72_8_ + 0x20);
          uVar6 = *(undefined8 *)(tmp_val._72_8_ + 0x28);
          uVar2 = *(undefined2 *)(tmp_val._72_8_ + 0x30);
          uVar7 = *(undefined8 *)(tmp_val._72_8_ + 0x34);
          uVar1 = *(undefined1 *)(tmp_val._72_8_ + 299);
          *(undefined8 *)(tmp_val._72_8_ + 8) = 0;
          object_prep((object *)tmp_val._72_8_,*(object_kind **)tmp_val._72_8_,
                      *(wchar_t *)(*(long *)(tmp_val._72_8_ + 0x10) + 0xf8),RANDOMISE);
          *(undefined8 *)(tmp_val._72_8_ + 0x10) = uVar3;
          *(undefined8 *)(tmp_val._72_8_ + 0x18) = uVar4;
          *(undefined8 *)(tmp_val._72_8_ + 0x20) = uVar5;
          *(undefined8 *)(tmp_val._72_8_ + 0x28) = uVar6;
          *(undefined2 *)(tmp_val._72_8_ + 0x30) = uVar2;
          *(undefined8 *)(tmp_val._72_8_ + 0x34) = uVar7;
          *(undefined1 *)(tmp_val._72_8_ + 299) = uVar1;
          copy_artifact_data((object *)tmp_val._72_8_,*(artifact **)(tmp_val._72_8_ + 0x10));
        }
        wiz_display_item((object *)tmp_val._72_8_,true,player);
        for (update = L'\0'; update < L'\x11'; update = update + L'\x01') {
          strnfmt(prompt_1 + 0x48,0x50,"Enter new %s setting: ",
                  do_cmd_wiz_tweak_item::obj_mods[update]);
          strnfmt((char *)&val,0x50,"%d",
                  (ulong)(uint)(int)*(short *)(tmp_val._72_8_ + 0x52 + (long)update * 2));
          _Var8 = get_string(prompt_1 + 0x48,(char *)&val,0x50);
          if (!_Var8) {
            if (e._4_4_ != 0) {
              wiz_play_item_standard_upkeep(player,(object *)tmp_val._72_8_);
              return;
            }
            wiz_play_item_notify_changed();
            return;
          }
          _Var8 = get_int_from_string((char *)&val,&local_70);
          if (_Var8) {
            *(short *)(tmp_val._72_8_ + 0x52 + (long)update * 2) = (short)local_70;
            wiz_display_item((object *)tmp_val._72_8_,true,player);
          }
        }
        strnfmt(prompt_2 + 0x48,0x50,"Enter new %s setting: ","AC bonus");
        strnfmt((char *)&val,0x50,"%d",(ulong)(uint)(int)*(short *)(tmp_val._72_8_ + 0x46));
        _Var8 = get_string(prompt_2 + 0x48,(char *)&val,0x50);
        if (_Var8) {
          _Var8 = get_int_from_string((char *)&val,&local_70);
          if (_Var8) {
            *(undefined2 *)(tmp_val._72_8_ + 0x46) = (undefined2)local_70;
            wiz_display_item((object *)tmp_val._72_8_,true,player);
          }
          strnfmt(prompt_3 + 0x48,0x50,"Enter new %s setting: ","to-hit");
          strnfmt((char *)&val,0x50,"%d",(ulong)(uint)(int)*(short *)(tmp_val._72_8_ + 0x48));
          _Var8 = get_string(prompt_3 + 0x48,(char *)&val,0x50);
          if (_Var8) {
            _Var8 = get_int_from_string((char *)&val,&local_70);
            if (_Var8) {
              *(undefined2 *)(tmp_val._72_8_ + 0x48) = (undefined2)local_70;
              wiz_display_item((object *)tmp_val._72_8_,true,player);
            }
            strnfmt(local_218,0x50,"Enter new %s setting: ","to-dam");
            strnfmt((char *)&val,0x50,"%d",(ulong)(uint)(int)*(short *)(tmp_val._72_8_ + 0x4a));
            _Var8 = get_string(local_218,(char *)&val,0x50);
            if (_Var8) {
              _Var8 = get_int_from_string((char *)&val,&local_70);
              if (_Var8) {
                *(undefined2 *)(tmp_val._72_8_ + 0x4a) = (undefined2)local_70;
                wiz_display_item((object *)tmp_val._72_8_,true,player);
              }
              if (e._4_4_ == 0) {
                wiz_play_item_notify_changed();
              }
              else {
                wiz_play_item_standard_upkeep(player,(object *)tmp_val._72_8_);
              }
            }
            else if (e._4_4_ == 0) {
              wiz_play_item_notify_changed();
            }
            else {
              wiz_play_item_standard_upkeep(player,(object *)tmp_val._72_8_);
            }
          }
          else if (e._4_4_ == 0) {
            wiz_play_item_notify_changed();
          }
          else {
            wiz_play_item_standard_upkeep(player,(object *)tmp_val._72_8_);
          }
        }
        else if (e._4_4_ == 0) {
          wiz_play_item_notify_changed();
        }
        else {
          wiz_play_item_standard_upkeep(player,(object *)tmp_val._72_8_);
        }
      }
      else if (e._4_4_ == 0) {
        wiz_play_item_notify_changed();
      }
      else {
        wiz_play_item_standard_upkeep(player,(object *)tmp_val._72_8_);
      }
    }
  }
  return;
}

Assistant:

void do_cmd_wiz_tweak_item(struct command *cmd)
{
	static const char *obj_mods[] = {
		#define STAT(a) #a,
		#include "list-stats.h"
		#undef STAT
		#define OBJ_MOD(a) #a,
		#include "list-object-modifiers.h"
		#undef OBJ_MOD
		NULL
	};
	struct object *obj;
	char tmp_val[80];
	int i, val;
	int update = 0;

	/* Get the item to tweak. */
	if (cmd_get_arg_item(cmd, "item", &obj) != CMD_OK) {
		if (!get_item(&obj, "Tweak which item? ",
				"You have nothing to tweak.", cmd->code,
				NULL, (USE_EQUIP | USE_INVEN | USE_QUIVER |
				USE_FLOOR))) {
			return;
		}
		cmd_set_arg_item(cmd, "item", obj);
	}

	/* Hack -- leave artifacts alone */
	if (obj->artifact) return;

	/*
	 * Check for whether updating the player information or let
	 * do_cmd_wiz_play_item() handle it.
	 */
	if (cmd_get_arg_choice(cmd, "update", &update) != CMD_OK) {
		update = 1;
	}

	/* Get ego name. */
	if (obj->ego) {
		strnfmt(tmp_val, sizeof(tmp_val), "%s", obj->ego->name);
	} else {
		strnfmt(tmp_val, sizeof(tmp_val), "-1");
	}
	if (!get_string("Enter ego item: ", tmp_val, sizeof(tmp_val))) return;

	/* Accept index or name */
	if (get_int_from_string(tmp_val, &val)) {
		if (val >= 0 && val < z_info->e_max) {
			obj->ego = &e_info[val];
		} else {
			obj->ego = NULL;
		}
	} else {
		obj->ego = lookup_ego_item(tmp_val, obj->tval, obj->sval);
	}
	if (obj->ego) {
		struct ego_item *e = obj->ego;
		struct object *prev = obj->prev;
		struct object *next = obj->next;
		struct object *known = obj->known;
		uint16_t oidx = obj->oidx;
		struct loc grid = obj->grid;
		bitflag notice = obj->notice;

		object_prep(obj, obj->kind, player->depth, RANDOMISE);
		obj->ego = e;
		obj->prev = prev;
		obj->next = next;
		obj->known = known;
		obj->oidx = oidx;
		obj->grid = grid;
		obj->notice = notice;
		ego_apply_magic(obj, player->depth, RANDOMISE);
	}
	wiz_display_item(obj, true, player);

	/* Get artifact name */
	if (obj->artifact) {
		strnfmt(tmp_val, sizeof(tmp_val), "%s", obj->artifact->name);
	} else {
		strnfmt(tmp_val, sizeof(tmp_val), "0");
	}
	if (!get_string("Enter new artifact: ", tmp_val, sizeof(tmp_val))) {
		if (update) {
			wiz_play_item_standard_upkeep(player, obj);
		} else {
			wiz_play_item_notify_changed();
		}
		return;
	}

	/* Accept index or name */
	if (get_int_from_string(tmp_val, &val)) {
		if (val > 0 && val < z_info->a_max) {
			obj->artifact = &a_info[val];
		} else {
			obj->artifact = NULL;
		}
	} else {
		obj->artifact = lookup_artifact_name(tmp_val);
	}
	if (obj->artifact) {
		const struct artifact *a = obj->artifact;
		struct object *prev = obj->prev;
		struct object *next = obj->next;
		struct object *known = obj->known;
		uint16_t oidx = obj->oidx;
		struct loc grid = obj->grid;
		bitflag notice = obj->notice;

		obj->ego = NULL;
		object_prep(obj, obj->kind, obj->artifact->alloc_min, RANDOMISE);
		obj->artifact = a;
		obj->prev = prev;
		obj->next = next;
		obj->known = known;
		obj->oidx = oidx;
		obj->grid = grid;
		obj->notice = notice;
		copy_artifact_data(obj, obj->artifact);
	}
	wiz_display_item(obj, true, player);

#define WIZ_TWEAK(attribute, name) do {\
		char prompt[80];\
		strnfmt(prompt, sizeof(prompt), "Enter new %s setting: ", name);\
		strnfmt(tmp_val, sizeof(tmp_val), "%d", obj->attribute);\
		if (!get_string(prompt, tmp_val, sizeof(tmp_val))) {\
			if (update) {\
				wiz_play_item_standard_upkeep(player, obj);\
			} else {\
				wiz_play_item_notify_changed();\
			}\
			return;\
		}\
		if (get_int_from_string(tmp_val, &val)) {\
			obj->attribute = val;\
			wiz_display_item(obj, true, player);\
		}\
} while (0)
	for (i = 0; i < OBJ_MOD_MAX; i++) {
		WIZ_TWEAK(modifiers[i], obj_mods[i]);
	}
	WIZ_TWEAK(to_a, "AC bonus");
	WIZ_TWEAK(to_h, "to-hit");
	WIZ_TWEAK(to_d, "to-dam");

	if (update) {
		wiz_play_item_standard_upkeep(player, obj);
	} else {
		wiz_play_item_notify_changed();
	}
}